

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

TidyOptionImpl * prvTidygetNextOption(TidyDocImpl *doc,TidyIterator *iter)

{
  TidyIterator local_30;
  TidyIterator local_28;
  size_t optId;
  TidyOptionImpl *option;
  TidyIterator *iter_local;
  TidyDocImpl *doc_local;
  
  optId = 0;
  if (iter != (TidyIterator *)0x0) {
    local_28 = *iter;
    if ((local_28 != (TidyIterator)0x0) && (local_28 < (TidyIterator)0x60)) {
      optId = (size_t)(option_defs + (long)local_28);
      local_28 = (TidyIterator)((long)&local_28->_opaque + 1);
    }
    if (local_28 < (TidyIterator)0x60) {
      local_30 = local_28;
    }
    else {
      local_30 = (TidyIterator)0x0;
    }
    *iter = local_30;
    return (TidyOptionImpl *)optId;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/config.c"
                ,0x641,"const TidyOptionImpl *prvTidygetNextOption(TidyDocImpl *, TidyIterator *)");
}

Assistant:

const TidyOptionImpl*  TY_(getNextOption)( TidyDocImpl* ARG_UNUSED(doc),
                                           TidyIterator* iter )
{
  const TidyOptionImpl* option = NULL;
  size_t optId;
  assert( iter != NULL );
  optId = (size_t) *iter;
  if ( optId > TidyUnknownOption && optId < N_TIDY_OPTIONS )
  {
    option = &option_defs[ optId ];
    optId++;
  }
  *iter = (TidyIterator) ( optId < N_TIDY_OPTIONS ? optId : (size_t)0 );
  return option;
}